

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Status __thiscall leveldb::Footer::DecodeFrom(Footer *this,Slice *input)

{
  bool bVar1;
  char *d;
  char *pcVar2;
  size_t sVar3;
  Slice *in_RDX;
  Slice local_90;
  char *local_80;
  char *end;
  undefined1 local_59;
  Slice local_58;
  Slice local_48;
  long local_38;
  uint64_t magic;
  uint32_t magic_hi;
  uint32_t magic_lo;
  char *magic_ptr;
  Slice *input_local;
  Footer *this_local;
  Status *result;
  
  magic_ptr = (char *)in_RDX;
  input_local = input;
  this_local = this;
  _magic_hi = Slice::data(in_RDX);
  _magic_hi = _magic_hi + 0x28;
  magic._4_4_ = DecodeFixed32(_magic_hi);
  magic._0_4_ = DecodeFixed32(_magic_hi + 4);
  local_38 = CONCAT44((uint32_t)magic,magic._4_4_);
  if (local_38 == -0x24b88adb747f04a9) {
    local_59 = 0;
    BlockHandle::DecodeFrom(&this->metaindex_handle_,input);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      BlockHandle::DecodeFrom((BlockHandle *)&end,input + 1);
      Status::operator=((Status *)this,(Status *)&end);
      Status::~Status((Status *)&end);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      d = _magic_hi + 8;
      local_80 = d;
      pcVar2 = Slice::data((Slice *)magic_ptr);
      sVar3 = Slice::size((Slice *)magic_ptr);
      Slice::Slice(&local_90,d,(size_t)(pcVar2 + (sVar3 - (long)local_80)));
      *(char **)magic_ptr = local_90.data_;
      *(size_t *)(magic_ptr + 8) = local_90.size_;
    }
  }
  else {
    Slice::Slice(&local_48,"not an sstable (bad magic number)");
    Slice::Slice(&local_58);
    Status::Corruption((Status *)this,&local_48,&local_58);
  }
  return (Status)(char *)this;
}

Assistant:

Status Footer::DecodeFrom(Slice* input) {
  const char* magic_ptr = input->data() + kEncodedLength - 8;
  const uint32_t magic_lo = DecodeFixed32(magic_ptr);
  const uint32_t magic_hi = DecodeFixed32(magic_ptr + 4);
  const uint64_t magic = ((static_cast<uint64_t>(magic_hi) << 32) |
                          (static_cast<uint64_t>(magic_lo)));
  if (magic != kTableMagicNumber) {
    return Status::Corruption("not an sstable (bad magic number)");
  }

  Status result = metaindex_handle_.DecodeFrom(input);
  if (result.ok()) {
    result = index_handle_.DecodeFrom(input);
  }
  if (result.ok()) {
    // We skip over any leftover data (just padding for now) in "input"
    const char* end = magic_ptr + 8;
    *input = Slice(end, input->data() + input->size() - end);
  }
  return result;
}